

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall
Rml::Context::Context
          (Context *this,String *name,RenderManager *render_manager,
          TextInputHandler *text_input_handler)

{
  ElementPtr *pEVar1;
  ElementPtr *pEVar2;
  size_t *psVar3;
  pointer pcVar4;
  ScrollController *pSVar5;
  code *pcVar6;
  Element *pEVar7;
  undefined8 uVar8;
  bool bVar9;
  Element *pEVar10;
  ScrollController *pSVar11;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c0;
  PropertyDefinition *local_b8;
  int local_b0;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  Element *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  String *local_78;
  undefined1 local_70 [32];
  String *local_50;
  XMLAttributes local_48;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Context_00334010;
  local_50 = &this->name;
  local_80 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_80;
  pcVar4 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar4,pcVar4 + name->_M_string_length);
  (this->dimensions).x = 0;
  (this->dimensions).y = 0;
  this->density_independent_pixel_ratio = 1.0;
  local_78 = &this->documents_base_tag;
  local_88 = &(this->documents_base_tag).field_2;
  (this->documents_base_tag)._M_dataplus._M_p = (pointer)local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"body","");
  this->render_manager = render_manager;
  (this->active_themes).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_themes).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_themes).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar1 = &this->root;
  (this->scroll_controller)._M_t.
  super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>._M_t.
  super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>.
  super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl = (ScrollController *)0x0;
  local_90 = &(this->cursor_name).field_2;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_chain).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->document_focus_history).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->document_focus_history).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->document_focus_history).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unloaded_documents).
  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unloaded_documents).
  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unloaded_documents).
  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  (this->last_click_mouse_position).x = 0;
  (this->last_click_mouse_position).y = 0;
  (this->mouse_position).x = 0;
  (this->mouse_position).y = 0;
  (this->cursor_name)._M_dataplus._M_p = (pointer)local_90;
  (this->cursor_name)._M_string_length = 0;
  (this->cursor_name).field_2._M_local_buf[0] = '\0';
  pEVar2 = &this->cursor_proxy;
  (this->cursor_proxy)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  (this->drag_hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->drag_hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->drag_hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = &(this->data_models).mMask;
  (this->data_models).mKeyVals = (Node *)psVar3;
  (this->data_models).mInfo = (uint8_t *)psVar3;
  (this->data_models).mNumElements = 0;
  (this->data_models).mMask = 0;
  (this->data_models).mMaxNumElementsAllowed = 0;
  (this->data_models).mInfoInc = 0x20;
  (this->data_models).mInfoHashShift = 0;
  (this->default_data_type_register)._M_t.
  super___uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataTypeRegister_*,_std::default_delete<Rml::DataTypeRegister>_>.
  super__Head_base<0UL,_Rml::DataTypeRegister_*,_false>._M_head_impl = (DataTypeRegister *)0x0;
  this->text_input_handler = text_input_handler;
  this->next_update_timeout = 0.0;
  this->instancer = (ContextInstancer *)0x0;
  local_e8._0_8_ = &local_d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"*","");
  local_70._0_8_ = (Element *)(local_70 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"#root","");
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement
            ((Factory *)&local_98,(Element *)0x0,(String *)local_e8,(String *)local_70,&local_48);
  pEVar7 = local_98;
  local_98 = (Element *)0x0;
  pEVar10 = (pEVar1->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  (pEVar1->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = pEVar7;
  if (pEVar10 != (Element *)0x0) {
    (**(code **)((long)(pEVar10->super_ScriptInterface).super_Releasable + 0x10))();
  }
  if (local_98 != (Element *)0x0) {
    (**(code **)(*(long *)local_98 + 0x10))();
  }
  local_98 = (Element *)0x0;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_48.m_container);
  if ((Element *)local_70._0_8_ != (Element *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
  }
  Element::SetId((pEVar1->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                 _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,name);
  Element::SetOffset((pEVar1->_M_t).
                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                     super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,(Vector2f)0x0,
                     (Element *)0x0,false);
  pEVar10 = (pEVar1->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,0);
  local_c0._0_4_ = NUMBER;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,ZIndex,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ = (Element *)0x0;
  local_e8._8_8_ = (pointer)0x0;
  local_d8._M_allocated_capacity = 0;
  Factory::InstanceElement
            ((Factory *)local_70,(Element *)0x0,local_78,local_78,(XMLAttributes *)local_e8);
  uVar8 = local_70._0_8_;
  local_70._0_8_ = (long *)0x0;
  pEVar10 = (pEVar2->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  (pEVar2->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)uVar8;
  if (pEVar10 != (Element *)0x0) {
    (**(code **)((long)(pEVar10->super_ScriptInterface).super_Releasable + 0x10))();
  }
  if ((long *)local_70._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 0x10))();
  }
  local_70._0_8_ = (pointer)0x0;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)local_e8);
  pEVar10 = (pEVar2->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  if (pEVar10 == (Element *)0x0) {
    pEVar10 = (Element *)0x0;
  }
  else {
    pEVar10 = (Element *)__dynamic_cast(pEVar10,&Element::typeinfo,&ElementDocument::typeinfo,0);
  }
  if (pEVar10 == (Element *)0x0) {
    bVar9 = Assert("RMLUI_ASSERT(cursor_proxy_document)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Context.cpp"
                   ,0x45);
    if (!bVar9) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
  }
  *(Context **)((long)&pEVar10[1].tag.field_2 + 8) = this;
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,(Colourb)0xffffff);
  local_c0._0_4_ = COLOUR;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,BackgroundColor,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,0);
  local_c0._0_4_ = PX;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,BorderTopWidth,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,0);
  local_c0._0_4_ = PX;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,BorderRightWidth,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,0);
  local_c0._0_4_ = PX;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,BorderBottomWidth,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,0);
  local_c0._0_4_ = PX;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,BorderLeftWidth,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  Property::Property((Property *)local_e8);
  Element::SetProperty(pEVar10,Decorator,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,0);
  local_c0._0_4_ = KEYWORD;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,OverflowX,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ = (Element *)0x2d;
  Variant::Set((Variant *)local_e8,0);
  local_c0._0_4_ = KEYWORD;
  local_c0._4_4_ = -1;
  local_b8 = (PropertyDefinition *)0x0;
  local_b0 = -1;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(pEVar10,OverflowY,(Property *)local_e8);
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  Variant::~Variant((Variant *)local_e8);
  local_e8._0_8_ =
       (pEVar1->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
            ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)&this->document_focus_history,
             (Element **)local_e8);
  this->focus = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  this->drag = (Element *)0x0;
  this->drag_started = false;
  this->drag_verbose = false;
  this->mouse_active = false;
  this->hover = (Element *)0x0;
  this->active = (Element *)0x0;
  this->last_click_element = (Element *)0x0;
  this->last_click_time = 0.0;
  this->drag_clone = (Element *)0x0;
  this->drag_hover = (Element *)0x0;
  this->enable_cursor = true;
  pSVar11 = (ScrollController *)operator_new(0x40);
  (pSVar11->autoscroll_accumulated_length).x = 0.0;
  (pSVar11->autoscroll_accumulated_length).y = 0.0;
  pSVar11->autoscroll_moved = false;
  pSVar11->smoothscroll_prefer_instant = false;
  *(undefined2 *)&pSVar11->field_0x2a = 0;
  pSVar11->smoothscroll_speed_factor = 0.0;
  pSVar11->previous_update_time = 0.0;
  (pSVar11->autoscroll_start_position).x = 0;
  (pSVar11->autoscroll_start_position).y = 0;
  *(undefined8 *)pSVar11 = 0;
  pSVar11->target = (Element *)0x0;
  (pSVar11->smoothscroll_target_distance).x = 0.0;
  (pSVar11->smoothscroll_target_distance).y = 0.0;
  (pSVar11->smoothscroll_scrolled_distance).x = 0.0;
  (pSVar11->smoothscroll_scrolled_distance).y = 0.0;
  pSVar11->smoothscroll_speed_factor = 1.0;
  pSVar5 = (this->scroll_controller)._M_t.
           super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
           .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
  (this->scroll_controller)._M_t.
  super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>._M_t.
  super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>.
  super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl = pSVar11;
  if (pSVar5 != (ScrollController *)0x0) {
    operator_delete(pSVar5,0x40);
  }
  return;
}

Assistant:

Context::Context(const String& name, RenderManager* render_manager, TextInputHandler* text_input_handler) :
	name(name), render_manager(render_manager), text_input_handler(text_input_handler)
{
	instancer = nullptr;

	root = Factory::InstanceElement(nullptr, "*", "#root", XMLAttributes());
	root->SetId(name);
	root->SetOffset(Vector2f(0, 0), nullptr);
	root->SetProperty(PropertyId::ZIndex, Property(0, Unit::NUMBER));

	cursor_proxy = Factory::InstanceElement(nullptr, documents_base_tag, documents_base_tag, XMLAttributes());
	ElementDocument* cursor_proxy_document = rmlui_dynamic_cast<ElementDocument*>(cursor_proxy.get());
	RMLUI_ASSERT(cursor_proxy_document);
	cursor_proxy_document->context = this;

	// The cursor proxy takes the style from its cloned element's document. The latter may define style rules for `<body>` which we don't want on the
	// proxy. Thus, we override some properties here that we in particular don't want to inherit from the client document, especially those that
	// result in decoration of the body element.
	cursor_proxy_document->SetProperty(PropertyId::BackgroundColor, Property(Colourb(255, 255, 255, 0), Unit::COLOUR));
	cursor_proxy_document->SetProperty(PropertyId::BorderTopWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderRightWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderBottomWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderLeftWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::Decorator, Property());
	cursor_proxy_document->SetProperty(PropertyId::OverflowX, Property(Style::Overflow::Visible));
	cursor_proxy_document->SetProperty(PropertyId::OverflowY, Property(Style::Overflow::Visible));

	document_focus_history.push_back(root.get());
	focus = root.get();
	hover = nullptr;
	active = nullptr;
	drag = nullptr;

	drag_started = false;
	drag_verbose = false;
	drag_clone = nullptr;
	drag_hover = nullptr;
	last_click_element = nullptr;
	last_click_time = 0;

	mouse_active = false;
	enable_cursor = true;

	scroll_controller = MakeUnique<ScrollController>();
}